

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O0

RealType __thiscall OpenMD::RNEMD::RNEMD::getDefaultDividingArea(RNEMD *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  double *pdVar2;
  long in_RDI;
  RealType RVar3;
  __type _Var4;
  RealType hVol;
  Thermo thermo;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> bSites;
  StuntDouble *sd_1;
  int isd_1;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> aSites;
  StuntDouble *sd;
  int isd;
  Snapshot *snap;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  double in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  SelectionManager *in_stack_ffffffffffffff00;
  errorStruct *this_01;
  errorStruct *in_stack_ffffffffffffff28;
  Thermo local_a8;
  Snapshot *in_stack_ffffffffffffff60;
  StuntDouble *local_70;
  StuntDouble *local_28;
  RealType local_8;
  
  if ((*(byte *)(in_RDI + 0x1c61) & 1) == 0) {
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    SnapshotManager::getCurrentSnapshot(this_00);
    if ((*(byte *)(in_RDI + 0x15e0) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x289) & 1) == 0) {
        _Var4 = std::pow<double,int>(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        *(double *)(in_RDI + 0x1c40) = _Var4 * 12.566370614359172;
        _Var4 = std::pow<double,int>(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        *(double *)(in_RDI + 0x1c50) = (_Var4 * 12.566370614359172) / 3.0;
      }
      else {
        if (*(int *)(in_RDI + 0x240) == 0) {
          RVar3 = Snapshot::getYZarea(in_stack_ffffffffffffff60);
          *(double *)(in_RDI + 0x1c40) = RVar3 * 2.0;
        }
        else if (*(int *)(in_RDI + 0x240) == 1) {
          RVar3 = Snapshot::getXZarea(in_stack_ffffffffffffff60);
          *(double *)(in_RDI + 0x1c40) = RVar3 * 2.0;
        }
        else {
          RVar3 = Snapshot::getXYarea(in_stack_ffffffffffffff60);
          *(double *)(in_RDI + 0x1c40) = RVar3 * 2.0;
        }
        *(double *)(in_RDI + 0x1c50) = *(double *)(in_RDI + 0x1c40) * *(double *)(in_RDI + 0x60);
      }
    }
    else {
      bVar1 = SelectionEvaluator::hasSurfaceArea((SelectionEvaluator *)(in_RDI + 0x9b0));
      if (bVar1) {
        RVar3 = SelectionEvaluator::getSurfaceArea
                          ((SelectionEvaluator *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *(RealType *)(in_RDI + 0x1c40) = RVar3;
        RVar3 = SelectionEvaluator::getVolume
                          ((SelectionEvaluator *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *(RealType *)(in_RDI + 0x1c50) = RVar3;
      }
      else {
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x3e1223
                  );
        SelectionEvaluator::evaluate((SelectionEvaluator *)in_stack_ffffffffffffff28);
        SelectionManager::setSelectionSet
                  (in_stack_ffffffffffffff00,
                   (SelectionSet *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        SelectionSet::~SelectionSet((SelectionSet *)0x3e126d);
        local_28 = SelectionManager::beginSelected
                             (in_stack_ffffffffffffff00,
                              (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        while (local_28 != (StuntDouble *)0x0) {
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     in_stack_ffffffffffffff00,
                     (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          local_28 = SelectionManager::nextSelected
                               (in_stack_ffffffffffffff00,
                                (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                               );
        }
        in_stack_ffffffffffffff28 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n\twithout libqhull. Please rebuild OpenMD with qhull enabled."
                );
        *(undefined4 *)((long)((SelectionCompiler *)in_stack_ffffffffffffff28->errMsg + 6) + 0x84) =
             1;
        *(undefined4 *)((long)((SelectionCompiler *)in_stack_ffffffffffffff28->errMsg + 6) + 0x80) =
             1;
        simError();
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                   in_stack_ffffffffffffff00);
      }
    }
    if ((*(byte *)(in_RDI + 0x15e1) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x289) & 1) == 0) {
        _Var4 = std::pow<double,int>(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        *(double *)(in_RDI + 0x1c48) = _Var4 * 12.566370614359172;
        Thermo::Thermo(&local_a8,*(SimInfo **)(in_RDI + 8));
        RVar3 = Thermo::getHullVolume(&local_a8);
        _Var4 = std::pow<double,int>(RVar3,in_stack_fffffffffffffeec);
        *(double *)(in_RDI + 0x1c58) = RVar3 - (_Var4 * 12.566370614359172) / 3.0;
      }
      else {
        if (*(int *)(in_RDI + 0x240) == 0) {
          RVar3 = Snapshot::getYZarea(in_stack_ffffffffffffff60);
          *(double *)(in_RDI + 0x1c48) = RVar3 * 2.0;
        }
        else if (*(int *)(in_RDI + 0x240) == 1) {
          RVar3 = Snapshot::getXZarea(in_stack_ffffffffffffff60);
          *(double *)(in_RDI + 0x1c48) = RVar3 * 2.0;
        }
        else {
          RVar3 = Snapshot::getXYarea(in_stack_ffffffffffffff60);
          *(double *)(in_RDI + 0x1c48) = RVar3 * 2.0;
        }
        *(double *)(in_RDI + 0x1c58) = *(double *)(in_RDI + 0x1c48) * *(double *)(in_RDI + 0x60);
      }
    }
    else {
      bVar1 = SelectionEvaluator::hasSurfaceArea((SelectionEvaluator *)(in_RDI + 0xf00));
      if (bVar1) {
        RVar3 = SelectionEvaluator::getSurfaceArea
                          ((SelectionEvaluator *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *(RealType *)(in_RDI + 0x1c48) = RVar3;
        RVar3 = SelectionEvaluator::getVolume
                          ((SelectionEvaluator *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *(RealType *)(in_RDI + 0x1c58) = RVar3;
      }
      else {
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)0x3e154a
                  );
        SelectionEvaluator::evaluate((SelectionEvaluator *)in_stack_ffffffffffffff28);
        SelectionManager::setSelectionSet
                  (in_stack_ffffffffffffff00,
                   (SelectionSet *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        SelectionSet::~SelectionSet((SelectionSet *)0x3e158b);
        local_70 = SelectionManager::beginSelected
                             (in_stack_ffffffffffffff00,
                              (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        while (local_70 != (StuntDouble *)0x0) {
          std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                    ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
                     in_stack_ffffffffffffff00,
                     (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          local_70 = SelectionManager::nextSelected
                               (in_stack_ffffffffffffff00,
                                (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                               );
        }
        this_01 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n\twithout libqhull. Please rebuild OpenMD with qhull enabled."
                );
        this_01->severity = 1;
        this_01->isFatal = 1;
        simError();
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
                  ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)this_01)
        ;
      }
    }
    pdVar2 = std::min<double>((double *)(in_RDI + 0x1c40),(double *)(in_RDI + 0x1c48));
    *(double *)(in_RDI + 0x1c68) = *pdVar2;
    *(undefined1 *)(in_RDI + 0x1c61) = 1;
    local_8 = *(RealType *)(in_RDI + 0x1c68);
  }
  else {
    local_8 = *(RealType *)(in_RDI + 0x1c68);
  }
  return local_8;
}

Assistant:

RealType RNEMD::getDefaultDividingArea() {
    if (hasDividingArea_) return dividingArea_;

    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (hasSelectionA_) {
      if (evaluatorA_.hasSurfaceArea()) {
        areaA_   = evaluatorA_.getSurfaceArea();
        volumeA_ = evaluatorA_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> aSites;
        seleManA_.setSelectionSet(evaluatorA_.evaluate());
        for (sd = seleManA_.beginSelected(isd); sd != NULL;
             sd = seleManA_.nextSelected(isd)) {
          aSites.push_back(sd);
        }
#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshA = new ConvexHull();
        surfaceMeshA->computeHull(aSites);
        areaA_   = surfaceMeshA->getArea();
        volumeA_ = surfaceMeshA->getVolume();
        delete surfaceMeshA;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaA_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaA_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaA_ = 2.0 * snap->getXYarea();
        }

        volumeA_ = areaA_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, the sphere radius sets the surface area of the
        // dividing surface:
        areaA_   = 4.0 * Constants::PI * std::pow(sphereARadius_, 2);
        volumeA_ = 4.0 * Constants::PI * std::pow(sphereARadius_, 3) / 3.0;
      }
    }

    if (hasSelectionB_) {
      if (evaluatorB_.hasSurfaceArea()) {
        areaB_   = evaluatorB_.getSurfaceArea();
        volumeB_ = evaluatorB_.getVolume();
      } else {
        int isd;
        StuntDouble* sd;
        std::vector<StuntDouble*> bSites;
        seleManB_.setSelectionSet(evaluatorB_.evaluate());
        for (sd = seleManB_.beginSelected(isd); sd != NULL;
             sd = seleManB_.nextSelected(isd)) {
          bSites.push_back(sd);
        }

#if defined(HAVE_QHULL)
        ConvexHull* surfaceMeshB = new ConvexHull();
        surfaceMeshB->computeHull(bSites);
        areaB_   = surfaceMeshB->getArea();
        volumeB_ = surfaceMeshB->getVolume();
        delete surfaceMeshB;
#else
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "RNEMD::getDividingArea : Hull calculation is not possible\n"
                 "\twithout libqhull. Please rebuild OpenMD with qhull "
                 "enabled.");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
#endif
      }
    } else {
      if (usePeriodicBoundaryConditions_) {
        // in periodic boundaries, the surface area is twice the
        // area of the current box, normal to the privileged axis:
        switch (rnemdPrivilegedAxis_) {
        case rnemdX:
          areaB_ = 2.0 * snap->getYZarea();
          break;
        case rnemdY:
          areaB_ = 2.0 * snap->getXZarea();
          break;
        case rnemdZ:
        default:
          areaB_ = 2.0 * snap->getXYarea();
        }

        volumeB_ = areaB_ * slabWidth_;
      } else {
        // in non-periodic simulations, without explicitly setting
        // selections, but if a sphereBradius has been set, just use that:
        areaB_ = 4.0 * Constants::PI * pow(sphereBRadius_, 2);
        Thermo thermo(info_);
        RealType hVol = thermo.getHullVolume();
        volumeB_ = hVol - 4.0 * Constants::PI * pow(sphereBRadius_, 3) / 3.0;
      }
    }

    dividingArea_    = min(areaA_, areaB_);
    hasDividingArea_ = true;
    return dividingArea_;
  }